

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadField(BinaryReader *this,TypeMut *out_value)

{
  Type TVar1;
  long lVar2;
  Type TVar3;
  bool bVar4;
  Result RVar5;
  long in_RAX;
  char *pcVar6;
  Enum EVar7;
  uint3 uStack_28;
  uint8_t mutable_;
  Type field_type;
  
  _uStack_28 = in_RAX;
  RVar5 = ReadType(this,&field_type,"field type");
  lVar2 = _uStack_28;
  EVar7 = Error;
  if (RVar5.enum_ != Error) {
    TVar3.enum_ = field_type.enum_;
    bVar4 = IsConcreteType(this,field_type);
    if (bVar4) {
      _uStack_28 = (uint)uStack_28;
      RVar5 = ReadU8(this,&mutable_,"field mutability");
      EVar7 = Error;
      if (RVar5.enum_ != Error) {
        if (mutable_ < 2) {
          (out_value->type).enum_ = TVar3.enum_;
          out_value->mutable_ = (bool)mutable_;
          EVar7 = Ok;
        }
        else {
          PrintError(this,"field mutability must be 0 or 1");
        }
      }
    }
    else {
      pcVar6 = "";
      if (lVar2 < 0) {
        pcVar6 = "-";
      }
      TVar1.enum_ = -TVar3.enum_;
      if (Any < TVar3.enum_) {
        TVar1.enum_ = TVar3.enum_;
      }
      PrintError(this,"expected valid field type (got %s%#x)",pcVar6,(ulong)(uint)TVar1.enum_);
    }
  }
  return (Result)EVar7;
}

Assistant:

Result BinaryReader::ReadField(TypeMut* out_value) {
  // TODO: Reuse for global header too?
  Type field_type;
  CHECK_RESULT(ReadType(&field_type, "field type"));
  ERROR_UNLESS(IsConcreteType(field_type),
               "expected valid field type (got " PRItypecode ")",
               WABT_PRINTF_TYPE_CODE(field_type));

  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadU8(&mutable_, "field mutability"));
  ERROR_UNLESS(mutable_ <= 1, "field mutability must be 0 or 1");
  out_value->type = field_type;
  out_value->mutable_ = mutable_;
  return Result::Ok;
}